

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_> *pFVar2
  ;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar3;
  bool bVar4;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  value_type vVar8;
  value_type vVar9;
  
  uVar5 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::size(&((fadexpr->fadexpr_).left_)->fadexpr_);
  uVar1 = (((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar5) {
    uVar1 = uVar5;
  }
  uVar5 = (this->dx_).num_elts;
  if (uVar1 == uVar5) {
    if (uVar1 == 0) goto LAB_00faab7b;
    pdVar6 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar5 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00faab7b;
    }
    if (uVar5 != 0) {
      pdVar6 = (this->dx_).ptr_to_data;
      if (pdVar6 != (double *)0x0) {
        operator_delete__(pdVar6);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar7 = (ulong)uVar1 << 3;
    }
    pdVar6 = (double *)operator_new__(uVar7);
    (this->dx_).ptr_to_data = pdVar6;
  }
  bVar4 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::hasFastAccess(&((fadexpr->fadexpr_).left_)->fadexpr_);
  if ((bVar4) &&
     ((((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts != 0))
  {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        vVar8 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar7);
        pdVar6[uVar7] = vVar8;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      vVar8 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
              ::dx(&fadexpr->fadexpr_,(int)uVar7);
      pdVar6[uVar7] = vVar8;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
LAB_00faab7b:
  vVar9 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::val(&((fadexpr->fadexpr_).left_)->fadexpr_);
  pFVar2 = (fadexpr->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).right_;
  this->val_ = vVar9 / (((double)(pFVar3->fadexpr_).left_.constant_ +
                        ((pFVar3->fadexpr_).right_)->val_) * (pFVar2->fadexpr_).left_.constant_);
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}